

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-slays.c
# Opt level: O1

_Bool same_monsters_slain(wchar_t slay1,wchar_t slay2)

{
  char *__s1;
  int iVar1;
  
  if (slays[slay1].race_flag == slays[slay2].race_flag) {
    if ((slays[slay1].base == (char *)0x0) && (slays[slay2].base == (char *)0x0)) {
      return true;
    }
    __s1 = slays[slay1].base;
    if (__s1 != (char *)0x0) {
      if (slays[slay2].base == (char *)0x0) {
        return false;
      }
      if (__s1 != (char *)0x0) goto LAB_001ad9cb;
    }
    if (slays[slay2].base == (char *)0x0) {
LAB_001ad9cb:
      iVar1 = strcmp(__s1,slays[slay2].base);
      return iVar1 == 0;
    }
  }
  return false;
}

Assistant:

bool same_monsters_slain(int slay1, int slay2)
{
	if (slays[slay1].race_flag != slays[slay2].race_flag) return false;
	if (!slays[slay1].base && !slays[slay2].base) return true;
	if (slays[slay1].base && !slays[slay2].base) return false;
	if (!slays[slay1].base && slays[slay2].base) return false;
	if (streq(slays[slay1].base, slays[slay2].base)) return true;
	return false;
}